

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

void __thiscall Sphere::GetUV(Sphere *this,Vec3 *pos,float *u,float *v)

{
  float *in_RCX;
  float *in_RDX;
  Vec3 *in_RSI;
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  double dVar3;
  undefined4 extraout_XMM0_Db_00;
  double dVar4;
  float theta;
  float phi;
  
  fVar1 = Vec3::z(in_RSI);
  fVar2 = Vec3::x(in_RSI);
  dVar3 = std::atan2((double)(ulong)(uint)fVar1,(double)CONCAT44(extraout_XMM0_Db,fVar2));
  fVar1 = Vec3::y(in_RSI);
  dVar4 = std::asin((double)CONCAT44(extraout_XMM0_Db_00,fVar1));
  *in_RDX = 1.0 - (SUB84(dVar3,0) + 3.1415927) / 6.2831855;
  *in_RCX = (SUB84(dVar4,0) + 1.5707964) / 3.1415927;
  return;
}

Assistant:

void	 
Sphere::GetUV(const Vec3& pos, float& u, float& v) const {
	float phi   = atan2(pos.z(), pos.x());
	float theta = asin(pos.y());
	u = 1.0f - (phi + M_PI) / (2.0f * M_PI);
	v = (theta + M_PI / 2.0f) / M_PI;
}